

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O2

CURLcode Curl_doh_is_resolved(Curl_easy *data,Curl_dns_entry **dnsp)

{
  dynbuf *s;
  byte bVar1;
  DNStype DVar2;
  dohdata *pdVar3;
  sockaddr *psVar4;
  undefined8 uVar5;
  char *pcVar6;
  DOHcode DVar7;
  DNStype DVar8;
  CURLcode CVar9;
  uchar *puVar10;
  size_t sVar11;
  long lVar12;
  size_t sVar13;
  size_t sVar14;
  Curl_addrinfo *pCVar15;
  Curl_dns_entry *pCVar16;
  sa_family_t sVar17;
  int iVar18;
  char *pcVar19;
  ushort uVar20;
  uint uVar21;
  long lVar22;
  Curl_addrinfo *pCVar23;
  ushort uVar24;
  Curl_addrinfo *addr;
  dynbuf *s_00;
  uint uVar25;
  size_t sVar26;
  dohentry *s_01;
  ushort uVar27;
  ulong uVar28;
  anon_union_16_2_f9ece763_for_ip *paVar29;
  bool bVar30;
  DOHcode rc [2];
  uint local_328 [2];
  char local_31e [126];
  dohentry de;
  
  pdVar3 = (data->req).doh;
  *dnsp = (Curl_dns_entry *)0x0;
  if (pdVar3 == (dohdata *)0x0) {
LAB_004715f5:
    CVar9 = CURLE_OUT_OF_MEMORY;
  }
  else {
    if ((pdVar3->probe[0].easy == (CURL_conflict *)0x0) &&
       (pdVar3->probe[1].easy == (CURL_conflict *)0x0)) {
      Curl_failf(data,"Could not DoH-resolve: %s",(data->state).async.hostname);
      return (((data->conn->bits).field_0x4 & 0x20) == 0) + CURLE_COULDNT_RESOLVE_PROXY;
    }
    if (pdVar3->pending != 0) {
      return CURLE_OK;
    }
    rc[0] = DOH_OK;
    rc[1] = DOH_OK;
    for (lVar22 = 8; lVar22 != 0x478; lVar22 = lVar22 + 0x238) {
      curl_multi_remove_handle
                (data->multi,*(Curl_easy **)(pdVar3->probe[0].dohbuffer + lVar22 + -0x14));
      Curl_close((Curl_easy **)(pdVar3->probe[0].dohbuffer + lVar22 + -0x14));
    }
    memset(&de,0,0x270);
    de.ttl = 0x7fffffff;
    for (lVar22 = 0; lVar22 != 0x80; lVar22 = lVar22 + 0x20) {
      Curl_dyn_init((dynbuf *)((long)&de.cname[0].bufr + lVar22),0x100);
    }
    lVar22 = 0;
LAB_00470cee:
    if (lVar22 != 2) {
      if (pdVar3->probe[lVar22].dnstype != 0) {
        s = &pdVar3->probe[lVar22].serverdoh;
        puVar10 = Curl_dyn_uptr(s);
        sVar11 = Curl_dyn_len(s);
        DVar2 = pdVar3->probe[lVar22].dnstype;
        local_328[0] = 0xc;
        DVar7 = DOH_TOO_SMALL_BUFFER;
        if ((((0xb < sVar11) && (DVar7 = DOH_DNS_BAD_ID, puVar10 != (uchar *)0x0)) &&
            (*puVar10 == '\0')) &&
           ((puVar10[1] == '\0' && (DVar7 = DOH_DNS_BAD_RCODE, (puVar10[3] & 0xf) == 0)))) {
          uVar27 = *(ushort *)(puVar10 + 4) << 8 | *(ushort *)(puVar10 + 4) >> 8;
          sVar26 = 0xc;
          uVar21 = local_328[0];
          do {
            local_328[0] = uVar21;
            bVar30 = uVar27 == 0;
            uVar27 = uVar27 - 1;
            if (bVar30) {
              uVar27 = *(ushort *)(puVar10 + 6) << 8 | *(ushort *)(puVar10 + 6) >> 8;
              uVar24 = 0;
              uVar21 = local_328[0];
              goto LAB_00470de2;
            }
            DVar7 = skipqname(puVar10,sVar11,local_328);
            if (DVar7 != DOH_OK) goto LAB_004711a1;
            sVar26 = (size_t)(local_328[0] + 4);
            uVar21 = local_328[0] + 4;
          } while (sVar26 <= sVar11);
          DVar7 = DOH_DNS_OUT_OF_RANGE;
        }
        goto LAB_004711a1;
      }
      goto LAB_00471202;
    }
    CVar9 = CURLE_COULDNT_RESOLVE_HOST;
    if ((rc[0] == DOH_OK) || (rc[1] == DOH_OK)) {
      Curl_infof(data,"DoH Host name: %s",pdVar3->host);
      puVar10 = de.addr[0].ip.v4 + 1;
      Curl_infof(data,"TTL: %u seconds",(ulong)de.ttl);
      for (lVar22 = 0; lVar22 < de.numaddr; lVar22 = lVar22 + 1) {
        iVar18 = de.addr[lVar22].type;
        if (iVar18 == 0x1c) {
          curl_msnprintf((char *)local_328,0x80,"DoH AAAA: ");
          pcVar19 = local_31e;
          sVar11 = 0x76;
          for (uVar28 = 0; uVar28 < 0x10; uVar28 = uVar28 + 2) {
            pcVar6 = "    :";
            if (uVar28 == 0) {
              pcVar6 = "PK\x01\x02";
            }
            curl_msnprintf(pcVar19,sVar11,"%s%02x%02x",pcVar6 + 4,(ulong)puVar10[uVar28 - 1],
                           (ulong)puVar10[uVar28]);
            sVar14 = strlen(pcVar19);
            sVar11 = sVar11 - sVar14;
            pcVar19 = pcVar19 + sVar14;
          }
          Curl_infof(data,"%s",local_328);
        }
        else if (iVar18 == 1) {
          Curl_infof(data,"DoH A: %u.%u.%u.%u",(ulong)de.addr[lVar22].ip.v4[0],
                     (ulong)de.addr[lVar22].ip.v4[1],(ulong)de.addr[lVar22].ip.v4[2],
                     (ulong)de.addr[lVar22].ip.v4[3]);
        }
        puVar10 = puVar10 + 0x14;
      }
      s_01 = &de;
      for (lVar22 = 0; lVar22 < de.numcname; lVar22 = lVar22 + 1) {
        pcVar19 = Curl_dyn_ptr(s_01->cname);
        Curl_infof(data,"CNAME: %s",pcVar19);
        s_01 = (dohentry *)(s_01->cname + 1);
      }
      pcVar19 = pdVar3->host;
      uVar27 = (ushort)pdVar3->port;
      sVar14 = strlen(pcVar19);
      paVar29 = &de.addr[0].ip;
      addr = (Curl_addrinfo *)0x0;
      pCVar23 = (Curl_addrinfo *)0x0;
      for (lVar22 = 0; lVar22 < de.numaddr; lVar22 = lVar22 + 1) {
        iVar18 = ((dohaddr *)((long)paVar29 + -4))->type;
        lVar12 = 0x1c;
        if (iVar18 != 0x1c) {
          lVar12 = 0x10;
        }
        pCVar15 = (Curl_addrinfo *)(*Curl_ccalloc)(1,sVar14 + 0x31 + lVar12);
        if (pCVar15 == (Curl_addrinfo *)0x0) {
          Curl_freeaddrinfo(addr);
          goto LAB_004715e8;
        }
        pCVar15->ai_addr = (sockaddr *)(pCVar15 + 1);
        pcVar6 = (char *)((long)&pCVar15[1].ai_flags + lVar12);
        pCVar15->ai_canonname = pcVar6;
        memcpy(pcVar6,pcVar19,sVar14 + 1);
        if (addr == (Curl_addrinfo *)0x0) {
          addr = pCVar15;
        }
        if (pCVar23 != (Curl_addrinfo *)0x0) {
          pCVar23->ai_next = pCVar15;
        }
        pCVar15->ai_family = (uint)(iVar18 == 0x1c) * 8 + 2;
        pCVar15->ai_socktype = 1;
        pCVar15->ai_addrlen = (curl_socklen_t)lVar12;
        psVar4 = pCVar15->ai_addr;
        if (iVar18 == 0x1c) {
          uVar5 = *(undefined8 *)((long)paVar29 + 8);
          *(undefined8 *)(psVar4->sa_data + 6) = *(undefined8 *)paVar29;
          psVar4[1].sa_family = (short)uVar5;
          psVar4[1].sa_data[0] = (char)((ulong)uVar5 >> 0x10);
          psVar4[1].sa_data[1] = (char)((ulong)uVar5 >> 0x18);
          psVar4[1].sa_data[2] = (char)((ulong)uVar5 >> 0x20);
          psVar4[1].sa_data[3] = (char)((ulong)uVar5 >> 0x28);
          psVar4[1].sa_data[4] = (char)((ulong)uVar5 >> 0x30);
          psVar4[1].sa_data[5] = (char)((ulong)uVar5 >> 0x38);
          sVar17 = 10;
        }
        else {
          *(undefined4 *)(psVar4->sa_data + 2) = *(undefined4 *)paVar29;
          sVar17 = 2;
        }
        psVar4->sa_family = sVar17;
        *(ushort *)psVar4->sa_data = uVar27 << 8 | uVar27 >> 8;
        paVar29 = (anon_union_16_2_f9ece763_for_ip *)((long)paVar29 + 0x14);
        pCVar23 = pCVar15;
      }
      if (addr == (Curl_addrinfo *)0x0) {
LAB_004715e8:
        de_cleanup(&de);
        goto LAB_004715f5;
      }
      if (data->share != (Curl_share *)0x0) {
        Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
      }
      pCVar16 = Curl_cache_addr(data,addr,pdVar3->host,pdVar3->port);
      CVar9 = CURLE_COULDNT_RESOLVE_HOST;
      if (data->share != (Curl_share *)0x0) {
        Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
      }
      if (pCVar16 == (Curl_dns_entry *)0x0) {
        Curl_freeaddrinfo(addr);
      }
      else {
        (data->state).async.dns = pCVar16;
        *dnsp = pCVar16;
        CVar9 = CURLE_OK;
      }
    }
    de_cleanup(&de);
    (*Curl_cfree)((data->req).doh);
    (data->req).doh = (dohdata *)0x0;
  }
  return CVar9;
LAB_00470de2:
  do {
    local_328[0] = uVar21;
    bVar30 = uVar27 == 0;
    uVar27 = uVar27 - 1;
    if (bVar30) {
      uVar27 = *(ushort *)(puVar10 + 8) << 8 | *(ushort *)(puVar10 + 8) >> 8;
      uVar21 = local_328[0];
      goto LAB_004710a1;
    }
    DVar7 = skipqname(puVar10,sVar11,local_328);
    if (DVar7 != DOH_OK) goto LAB_004711a1;
    if (sVar11 < local_328[0] + 2) goto LAB_0047119d;
    uVar24 = *(ushort *)(puVar10 + (int)local_328[0]) << 8 |
             *(ushort *)(puVar10 + (int)local_328[0]) >> 8;
    DVar8 = (DNStype)uVar24;
    if (((uVar24 != 5) && (DVar8 != DNS_TYPE_DNAME)) && (DVar2 != DVar8)) {
      DVar7 = DOH_DNS_UNEXPECTED_TYPE;
      goto LAB_004711a1;
    }
    if (sVar11 < local_328[0] + 4) goto LAB_0047119d;
    if ((ushort)(*(ushort *)(puVar10 + (int)(local_328[0] + 2)) << 8 |
                *(ushort *)(puVar10 + (int)(local_328[0] + 2)) >> 8) != 1) {
      DVar7 = DOH_DNS_UNEXPECTED_CLASS;
      goto LAB_004711a1;
    }
    if (sVar11 < local_328[0] + 8) goto LAB_0047119d;
    uVar21 = *(uint *)(puVar10 + (int)(local_328[0] + 4));
    uVar21 = uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18;
    if (uVar21 < de.ttl) {
      de.ttl = uVar21;
    }
    uVar25 = local_328[0] + 10;
    uVar28 = (ulong)uVar25;
    if (sVar11 < uVar28) goto LAB_0047119d;
    uVar20 = *(ushort *)(puVar10 + (int)(local_328[0] + 8)) << 8 |
             *(ushort *)(puVar10 + (int)(local_328[0] + 8)) >> 8;
    uVar21 = uVar20 + uVar25;
    sVar26 = (size_t)uVar21;
    if (sVar11 < sVar26) goto LAB_0047119d;
    if (uVar24 == 0x1c) {
      if (uVar20 != 0x10) {
LAB_00471124:
        DVar7 = DOH_DNS_RDATA_LEN;
        goto LAB_004711a1;
      }
      lVar12 = (long)de.numaddr;
      if (lVar12 < 0x18) {
        de.addr[lVar12].type = 0x1c;
        uVar5 = *(undefined8 *)(puVar10 + (int)uVar25 + 8);
        *(undefined8 *)&de.addr[lVar12].ip = *(undefined8 *)(puVar10 + (int)uVar25);
        *(undefined8 *)((long)&de.addr[lVar12].ip + 8) = uVar5;
LAB_00471066:
        de.numaddr = de.numaddr + 1;
      }
      goto LAB_00470de2;
    }
    if (DVar8 != DNS_TYPE_CNAME) {
      if (DVar8 == DNS_TYPE_A) {
        if (uVar20 != 4) goto LAB_00471124;
        lVar12 = (long)de.numaddr;
        if (lVar12 < 0x18) {
          de.addr[lVar12].type = 1;
          *(undefined4 *)&de.addr[lVar12].ip = *(undefined4 *)(puVar10 + (int)uVar25);
          goto LAB_00471066;
        }
      }
      goto LAB_00470de2;
    }
    lVar12 = (long)de.numcname;
    if (lVar12 == 4) goto LAB_00470de2;
    de.numcname = de.numcname + 1;
    s_00 = de.cname + lVar12;
    iVar18 = -0x7f;
    do {
      if (sVar11 <= uVar28) goto LAB_0047119d;
      bVar1 = puVar10[uVar28];
      if ((bVar1 & 0xc0) == 0) {
        uVar25 = (int)uVar28 + 1;
        uVar28 = (ulong)uVar25;
        if ((ulong)bVar1 != 0) {
          sVar13 = Curl_dyn_len(s_00);
          if ((sVar13 == 0) || (CVar9 = Curl_dyn_addn(s_00,".",1), CVar9 == CURLE_OK)) {
            uVar28 = (ulong)(bVar1 + uVar25);
            if (sVar11 < uVar28) goto LAB_0047111c;
            CVar9 = Curl_dyn_addn(s_00,puVar10 + uVar25,(ulong)bVar1);
            if (CVar9 == CURLE_OK) goto LAB_0047101d;
          }
          DVar7 = DOH_OUT_OF_MEM;
          goto LAB_004711a1;
        }
      }
      else {
        if ((bVar1 & 0xc0) != 0xc0) {
LAB_0047111c:
          DVar7 = DOH_DNS_BAD_LABEL;
          goto LAB_004711a1;
        }
        uVar28 = (ulong)((int)uVar28 + 1);
        if (sVar11 <= uVar28) goto LAB_0047119d;
        uVar28 = (ulong)((uint)puVar10[uVar28] | (bVar1 & 0x3f) << 8);
      }
LAB_0047101d:
    } while ((bVar1 != 0) && (bVar30 = iVar18 != 0, iVar18 = iVar18 + 1, bVar30));
  } while (bVar1 == 0);
  DVar7 = DOH_DNS_LABEL_LOOP;
  goto LAB_004711a1;
  while( true ) {
    uVar21 = (uint)(ushort)(*(ushort *)(puVar10 + (int)(local_328[0] + 8)) << 8 |
                           *(ushort *)(puVar10 + (int)(local_328[0] + 8)) >> 8) + local_328[0] + 10;
    sVar26 = (size_t)uVar21;
    if (sVar11 < sVar26) break;
LAB_004710a1:
    local_328[0] = uVar21;
    bVar30 = uVar27 == 0;
    uVar27 = uVar27 - 1;
    if (bVar30) {
      uVar27 = *(ushort *)(puVar10 + 10) << 8 | *(ushort *)(puVar10 + 10) >> 8;
      uVar21 = local_328[0];
      goto LAB_00471135;
    }
    DVar7 = skipqname(puVar10,sVar11,local_328);
    if (DVar7 != DOH_OK) goto LAB_004711a1;
    if ((sVar11 < local_328[0] + 8) || (sVar11 < local_328[0] + 10)) break;
  }
  goto LAB_0047119d;
  while( true ) {
    uVar21 = (uint)(ushort)(*(ushort *)(puVar10 + (int)(local_328[0] + 8)) << 8 |
                           *(ushort *)(puVar10 + (int)(local_328[0] + 8)) >> 8) + local_328[0] + 10;
    sVar26 = (size_t)uVar21;
    if (sVar11 < sVar26) break;
LAB_00471135:
    local_328[0] = uVar21;
    bVar30 = uVar27 == 0;
    uVar27 = uVar27 - 1;
    if (bVar30) {
      DVar7 = DOH_DNS_MALFORMAT;
      if (sVar11 == sVar26) {
        DVar7 = DOH_OK;
        if (de.numaddr == 0 && de.numcname == 0) {
          DVar7 = DOH_NO_CONTENT;
        }
        if (uVar24 == 2) {
          DVar7 = DOH_OK;
        }
      }
      goto LAB_004711a1;
    }
    DVar7 = skipqname(puVar10,sVar11,local_328);
    if (DVar7 != DOH_OK) goto LAB_004711a1;
    if ((sVar11 < local_328[0] + 8) || (sVar11 < local_328[0] + 10)) break;
  }
LAB_0047119d:
  DVar7 = DOH_DNS_OUT_OF_RANGE;
LAB_004711a1:
  rc[lVar22] = DVar7;
  Curl_dyn_free(s);
  if (DVar7 != DOH_OK) {
    pcVar19 = "AAAA";
    if (pdVar3->probe[lVar22].dnstype == DNS_TYPE_A) {
      pcVar19 = "A";
    }
    Curl_infof(data,"DoH: %s type %s for %s",(long)&errors_rel + (long)(int)(&errors_rel)[DVar7],
               pcVar19,pdVar3->host);
  }
LAB_00471202:
  lVar22 = lVar22 + 1;
  goto LAB_00470cee;
}

Assistant:

CURLcode Curl_doh_is_resolved(struct Curl_easy *data,
                              struct Curl_dns_entry **dnsp)
{
  CURLcode result;
  struct dohdata *dohp = data->req.doh;
  *dnsp = NULL; /* defaults to no response */
  if(!dohp)
    return CURLE_OUT_OF_MEMORY;

  if(!dohp->probe[DOH_PROBE_SLOT_IPADDR_V4].easy &&
     !dohp->probe[DOH_PROBE_SLOT_IPADDR_V6].easy) {
    failf(data, "Could not DoH-resolve: %s", data->state.async.hostname);
    return CONN_IS_PROXIED(data->conn)?CURLE_COULDNT_RESOLVE_PROXY:
      CURLE_COULDNT_RESOLVE_HOST;
  }
  else if(!dohp->pending) {
    DOHcode rc[DOH_PROBE_SLOTS] = {
      DOH_OK, DOH_OK
    };
    struct dohentry de;
    int slot;
    /* remove DoH handles from multi handle and close them */
    for(slot = 0; slot < DOH_PROBE_SLOTS; slot++) {
      curl_multi_remove_handle(data->multi, dohp->probe[slot].easy);
      Curl_close(&dohp->probe[slot].easy);
    }
    /* parse the responses, create the struct and return it! */
    de_init(&de);
    for(slot = 0; slot < DOH_PROBE_SLOTS; slot++) {
      struct dnsprobe *p = &dohp->probe[slot];
      if(!p->dnstype)
        continue;
      rc[slot] = doh_decode(Curl_dyn_uptr(&p->serverdoh),
                            Curl_dyn_len(&p->serverdoh),
                            p->dnstype,
                            &de);
      Curl_dyn_free(&p->serverdoh);
      if(rc[slot]) {
        infof(data, "DoH: %s type %s for %s", doh_strerror(rc[slot]),
              type2name(p->dnstype), dohp->host);
      }
    } /* next slot */

    result = CURLE_COULDNT_RESOLVE_HOST; /* until we know better */
    if(!rc[DOH_PROBE_SLOT_IPADDR_V4] || !rc[DOH_PROBE_SLOT_IPADDR_V6]) {
      /* we have an address, of one kind or other */
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *ai;

      infof(data, "DoH Host name: %s", dohp->host);
      showdoh(data, &de);

      ai = doh2ai(&de, dohp->host, dohp->port);
      if(!ai) {
        de_cleanup(&de);
        return CURLE_OUT_OF_MEMORY;
      }

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, ai, dohp->host, dohp->port);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(ai);
      }
      else {
        data->state.async.dns = dns;
        *dnsp = dns;
        result = CURLE_OK;      /* address resolution OK */
      }
    } /* address processing done */

    /* Now process any build-specific attributes retrieved from DNS */

    /* All done */
    de_cleanup(&de);
    Curl_safefree(data->req.doh);
    return result;

  } /* !dohp->pending */

  /* else wait for pending DoH transactions to complete */
  return CURLE_OK;
}